

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

char * google::protobuf::internal::TcParser::
       MessageSetWireFormatParseLoopImpl<google::protobuf::MessageLite>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData param_4,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ExtensionSet *this;
  MessageLite *extendee;
  char *pcVar1;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData param_3_local;
  
  this = RefAt<google::protobuf::internal::ExtensionSet>(msg,(ulong)table->extension_offset);
  extendee = TcParseTableBase::default_instance(table);
  pcVar1 = ExtensionSet::ParseMessageSet<google::protobuf::MessageLite>
                     (this,ptr,extendee,&msg->_internal_metadata_,ctx);
  return pcVar1;
}

Assistant:

PROTOBUF_CC static const char* MessageSetWireFormatParseLoopImpl(
      PROTOBUF_TC_PARAM_NO_DATA_DECL) {
    return RefAt<ExtensionSet>(msg, table->extension_offset)
        .ParseMessageSet(
            ptr, static_cast<const MessageBaseT*>(table->default_instance()),
            &msg->_internal_metadata_, ctx);
  }